

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O3

string * __thiscall
cppcms::encoding::from_utf8_abi_cxx11_
          (string *__return_storage_ptr__,encoding *this,char *c_encoding,char *begin,char *end)

{
  bool bVar1;
  encodings_comparator cmp;
  allocator local_69;
  _Alloc_hider local_68;
  char *local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_60 = (char *)0x0;
  local_58 = '\0';
  local_68._M_p = &local_58;
  bVar1 = impl::encodings_comparator::operator()
                    ((encodings_comparator *)local_48,(char *)this,"utf8");
  if ((!bVar1) &&
     (bVar1 = impl::encodings_comparator::operator()
                        ((encodings_comparator *)local_48,"utf8",(char *)this), !bVar1)) {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,local_60,(ulong)c_encoding);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_68._M_p == &local_58) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_60;
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)local_48,(char *)this,&local_69);
  booster::locale::conv::from_utf<char>
            ((char *)__return_storage_ptr__,c_encoding,(string *)begin,(method_type)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68._M_p != &local_58) {
    operator_delete(local_68._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CPPCMS_API from_utf8(char const *c_encoding,char const *begin,char const *end)
{
	std::string result;
	if(is_utf8(c_encoding)) {
		result.assign(begin,end-begin);
		return result;
	}
	return locale::conv::from_utf<char>(begin,end,c_encoding);
}